

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O1

void msd_D_adaptive<vector_block<unsigned_char*,1024u>>
               (uchar **strings,size_t n,size_t depth,vector_block<unsigned_char_*,_1024U> *buckets)

{
  uchar *puVar1;
  long lVar2;
  size_t n_00;
  size_t j;
  long *__ptr;
  long lVar3;
  pointer pppuVar4;
  ushort uVar5;
  vector_block<unsigned_char_*,_1024U> *pvVar6;
  pointer pppuVar7;
  size_t __n;
  uchar **t;
  uchar **ppuVar8;
  long lVar9;
  uint i_1;
  size_t j_1;
  ulong uVar10;
  uint16_t cache [16];
  long local_78;
  ushort auStack_58 [20];
  
  if (n < 0x10000) {
    msd_D<vector_block<unsigned_char*,1024u>,unsigned_short>(strings,n,depth,buckets);
    return;
  }
  __ptr = (long *)malloc(0x80000);
  if ((n & 0xfffffffffffffff0) == 0) {
    uVar10 = 0;
  }
  else {
    uVar10 = 0;
    ppuVar8 = strings;
    do {
      lVar3 = 0;
      do {
        puVar1 = ppuVar8[lVar3];
        if (puVar1 == (uchar *)0x0) goto LAB_00206fc7;
        if (puVar1[depth] == '\0') {
          uVar5 = 0;
        }
        else {
          uVar5 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
        }
        auStack_58[lVar3] = uVar5;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x10);
      lVar3 = 0;
      t = ppuVar8;
      do {
        vector_block<unsigned_char_*,_1024U>::push_back(buckets + auStack_58[lVar3],t);
        lVar3 = lVar3 + 1;
        t = t + 1;
      } while (lVar3 != 0x10);
      uVar10 = uVar10 + 0x10;
      ppuVar8 = ppuVar8 + 0x10;
    } while (uVar10 < (n & 0xfffffffffffffff0));
  }
  local_78 = n - uVar10;
  if (uVar10 <= n && local_78 != 0) {
    ppuVar8 = strings + uVar10;
    do {
      puVar1 = *ppuVar8;
      if (puVar1 == (uchar *)0x0) {
LAB_00206fc7:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (puVar1[depth] == '\0') {
        uVar10 = 0;
      }
      else {
        uVar10 = (ulong)CONCAT11(puVar1[depth],puVar1[depth + 1]);
      }
      vector_block<unsigned_char_*,_1024U>::push_back(buckets + uVar10,ppuVar8);
      ppuVar8 = ppuVar8 + 1;
      local_78 = local_78 + -1;
    } while (local_78 != 0);
  }
  lVar3 = 0;
  pvVar6 = buckets;
  do {
    __ptr[lVar3] = ((long)(pvVar6->_index_block).
                          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar6->_index_block).
                         super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                         _M_impl.super__Vector_impl_data._M_start) * 0x80 -
                   (ulong)pvVar6->_left_in_block;
    lVar3 = lVar3 + 1;
    pvVar6 = pvVar6 + 1;
  } while (lVar3 != 0x10000);
  lVar3 = 0;
  lVar9 = 0;
  do {
    lVar2 = __ptr[lVar3];
    if (lVar2 != 0) {
      pppuVar4 = buckets[lVar3]._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pppuVar7 = buckets[lVar3]._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      if (pppuVar4 == pppuVar7) {
        __assert_fail("not v._index_block.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/vector_block.h"
                      ,0x5b,
                      "void copy(const vector_block<T, B> &, OutputIterator) [T = unsigned char *, B = 1024U, OutputIterator = unsigned char **]"
                     );
      }
      pvVar6 = buckets + lVar3;
      ppuVar8 = strings + lVar9;
      if (8 < (ulong)((long)pppuVar7 - (long)pppuVar4)) {
        uVar10 = 1;
        do {
          memmove(ppuVar8,pppuVar4[uVar10 - 1],0x2000);
          ppuVar8 = ppuVar8 + 0x400;
          uVar10 = uVar10 + 1;
          pppuVar4 = (pvVar6->_index_block).
                     super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl
                     .super__Vector_impl_data._M_start;
          pppuVar7 = (pvVar6->_index_block).
                     super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl
                     .super__Vector_impl_data._M_finish;
        } while (uVar10 < (ulong)((long)pppuVar7 - (long)pppuVar4 >> 3));
      }
      __n = (long)pvVar6->_insertpos - (long)pppuVar7[-1];
      if (__n != 0) {
        memmove(ppuVar8,pppuVar7[-1],__n);
      }
      lVar9 = lVar9 + lVar2;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10000);
  lVar3 = 0;
  do {
    vector_block<unsigned_char_*,_1024U>::clear
              ((vector_block<unsigned_char_*,_1024U> *)
               ((long)&(buckets->_index_block).
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0x280000);
  lVar3 = *__ptr;
  lVar9 = 1;
  do {
    n_00 = __ptr[lVar9];
    if (n_00 != 0) {
      if ((char)lVar9 != '\0') {
        msd_D_adaptive<vector_block<unsigned_char*,1024u>>(strings + lVar3,n_00,depth + 2,buckets);
      }
      lVar3 = lVar3 + n_00;
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x10000);
  free(__ptr);
  return;
}

Assistant:

static void
msd_D_adaptive(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 0x10000) {
		msd_D<Bucket, uint16_t>(strings, n, depth, buckets);
		return;
	}
	size_t* bucketsize = (size_t*) malloc(0x10000 * sizeof(size_t));
	size_t i=0;
	for (; i < n-n%16; i+=16) {
		uint16_t cache[16];
		for (size_t j=0; j < 16; ++j) {
			cache[j] = get_char<uint16_t>(strings[i+j], depth);
		}
		for (size_t j=0; j < 16; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		const uint16_t ch = get_char<uint16_t>(strings[i], depth);
		buckets[ch].push_back(strings[i]);
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_D_adaptive(
				strings+pos, bucketsize[i],
				depth+2, buckets);
		pos += bucketsize[i];
	}
	free(bucketsize);
}